

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall
ipx::IPM::SolveNewtonSystem
          (IPM *this,double *rb,double *rc,double *rl,double *ru,double *sl,double *su,Step *step)

{
  double dVar1;
  double dVar2;
  int iVar3;
  StateDetail SVar4;
  Iterate *pIVar5;
  pointer pSVar6;
  size_t sVar7;
  double *pdVar8;
  pointer piVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double *pdVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  Vector rhs2;
  Vector rhs1;
  Vector local_68;
  Vector local_58;
  double *local_48;
  Model *local_40;
  double *local_38;
  
  pIVar5 = this->iterate_;
  local_40 = pIVar5->model_;
  iVar3 = local_40->num_rows_;
  pdVar12 = (double *)(long)iVar3;
  uVar19 = (long)local_40->num_cols_ + (long)pdVar12;
  local_58._M_size = uVar19;
  local_48 = sl;
  local_38 = rc;
  local_58._M_data = (double *)operator_new(uVar19 * 8);
  memset(local_58._M_data,0,uVar19 * 8);
  uVar14 = (long)pdVar12 * 8;
  local_68._M_size = (size_t)pdVar12;
  local_68._M_data = (double *)operator_new(uVar14);
  memset(local_68._M_data,0,uVar14);
  pdVar12 = local_38;
  iVar18 = (int)uVar19;
  if ((local_38 != (double *)0x0) && (0 < iVar18)) {
    uVar10 = 0;
    do {
      local_58._M_data[uVar10] = -local_38[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar19 & 0xffffffff) != uVar10);
  }
  if (0 < iVar18) {
    pSVar6 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      dVar20 = 0.0;
      dVar21 = 0.0;
      if (rl != (double *)0x0) {
        dVar21 = rl[uVar10];
      }
      if (ru != (double *)0x0) {
        dVar20 = ru[uVar10];
      }
      SVar4 = pSVar6[uVar10];
      if ((SVar4 & ~BARRIER_BOXED) == BARRIER_LB) {
        local_58._M_data[uVar10] =
             (dVar21 * (pIVar5->zl_)._M_data[uVar10] + local_48[uVar10]) /
             (pIVar5->xl_)._M_data[uVar10] + local_58._M_data[uVar10];
      }
      if (SVar4 - BARRIER_UB < 2) {
        local_58._M_data[uVar10] =
             local_58._M_data[uVar10] -
             (su[uVar10] - dVar20 * (pIVar5->zu_)._M_data[uVar10]) / (pIVar5->xu_)._M_data[uVar10];
      }
      if (SVar4 == FIXED) {
        local_58._M_data[uVar10] = 0.0;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar19 & 0xffffffff) != uVar10);
  }
  if ((rb != (double *)0x0) && (iVar3 != 0)) {
    pdVar13 = (double *)local_68._M_size;
    if ((double *)local_68._M_size != (double *)0x0) {
      pdVar13 = local_68._M_data;
    }
    memmove(pdVar13,rb,uVar14);
  }
  dVar21 = (this->control_->parameters_).super_ipx_parameters.kkt_tol;
  dVar20 = Iterate::mu(this->iterate_);
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  KKTSolver::Solve(this->kkt_,&local_58,&local_68,dVar21 * dVar20,&step->x,&step->y,this->info_);
  if ((this->info_->super_ipx_info).errflag == 0) {
    sVar7 = (step->y)._M_size;
    pdVar13 = (step->y)._M_data;
    if (0 < (long)sVar7) {
      pdVar11 = pdVar13;
      do {
        *pdVar11 = -*pdVar11;
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 < pdVar13 + sVar7);
    }
    uVar19 = uVar19 & 0xffffffff;
    if (0 < iVar18) {
      pSVar6 = (this->iterate_->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (step->x)._M_data;
      pdVar8 = (step->xl)._M_data;
      pdVar17 = (step->zl)._M_data;
      uVar14 = 0;
      do {
        SVar4 = pSVar6[uVar14];
        if (((SVar4 - IMPLIED_LB < 3) || (SVar4 == FREE)) || (SVar4 == FIXED)) {
          pdVar8[uVar14] = 0.0;
          dVar21 = 0.0;
        }
        else {
          if (rl == (double *)0x0) {
            dVar21 = 0.0;
          }
          else {
            dVar21 = rl[uVar14];
          }
          dVar21 = pdVar11[uVar14] - dVar21;
          pdVar8[uVar14] = dVar21;
          dVar21 = (local_48[uVar14] - dVar21 * (pIVar5->zl_)._M_data[uVar14]) /
                   (pIVar5->xl_)._M_data[uVar14];
        }
        pdVar17[uVar14] = dVar21;
        uVar14 = uVar14 + 1;
      } while (uVar19 != uVar14);
    }
    if (0 < iVar18) {
      pSVar6 = (this->iterate_->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (step->x)._M_data;
      pdVar8 = (step->xu)._M_data;
      pdVar17 = (step->zu)._M_data;
      uVar14 = 0;
      do {
        SVar4 = pSVar6[uVar14];
        if (((SVar4 - IMPLIED_LB < 3) || (SVar4 == FREE)) || (SVar4 == FIXED)) {
          pdVar8[uVar14] = 0.0;
          dVar21 = 0.0;
        }
        else {
          if (ru == (double *)0x0) {
            dVar21 = 0.0;
          }
          else {
            dVar21 = ru[uVar14];
          }
          dVar21 = dVar21 - pdVar11[uVar14];
          pdVar8[uVar14] = dVar21;
          dVar21 = (su[uVar14] - dVar21 * (pIVar5->zu_)._M_data[uVar14]) /
                   (pIVar5->xu_)._M_data[uVar14];
        }
        pdVar17[uVar14] = dVar21;
        uVar14 = uVar14 + 1;
      } while (uVar19 != uVar14);
    }
    if (0 < iVar18) {
      pSVar6 = (this->iterate_->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (step->zl)._M_data;
      pdVar8 = (step->zu)._M_data;
      uVar14 = 0;
      do {
        if (4 < pSVar6[uVar14] - FREE) {
          piVar9 = (local_40->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = piVar9[uVar14];
          lVar15 = (long)iVar3;
          iVar18 = piVar9[uVar14 + 1];
          dVar21 = 0.0;
          dVar20 = 0.0;
          if (iVar3 < iVar18) {
            do {
              dVar20 = dVar20 + pdVar13[(local_40->AI_).rowidx_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar15]] *
                                (local_40->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar15];
              lVar15 = lVar15 + 1;
            } while (iVar18 != lVar15);
          }
          if (pdVar12 != (double *)0x0) {
            dVar21 = pdVar12[uVar14];
          }
          dVar1 = (pIVar5->xl_)._M_data[uVar14];
          dVar16 = ABS(dVar1);
          if ((ulong)dVar16 < 0x7ff0000000000000) {
            dVar2 = (pIVar5->xu_)._M_data[uVar14];
            if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
              if (dVar2 * (pIVar5->zl_)._M_data[uVar14] < dVar1 * (pIVar5->zu_)._M_data[uVar14])
              goto LAB_003a374a;
            }
            else if (0x7fefffffffffffff < (ulong)dVar16) goto LAB_003a374a;
            dVar20 = (dVar21 + pdVar8[uVar14]) - dVar20;
            pdVar17 = pdVar11;
          }
          else {
LAB_003a374a:
            dVar20 = dVar20 + (pdVar11[uVar14] - dVar21);
            pdVar17 = pdVar8;
          }
          pdVar17[uVar14] = dVar20;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar19);
    }
  }
  operator_delete(local_68._M_data);
  operator_delete(local_58._M_data);
  return;
}

Assistant:

void IPM::SolveNewtonSystem(const double* rb, const double* rc,
                                    const double* rl, const double* ru,
                                    const double* sl, const double* su,
                                    Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    Vector& dx = step.x;
    Vector& dxl = step.xl;
    Vector& dxu = step.xu;
    Vector& dy = step.y;
    Vector& dzl = step.zl;
    Vector& dzu = step.zu;

    // Build RHS for KKT system.
    Vector rhs1(n+m), rhs2(m);
    if (rc) {
        for (Int j = 0; j < n+m; j++)
            rhs1[j] = -rc[j];
    }
    for (Int j = 0; j < n+m; j++) {
        double rlj = rl ? rl[j] : 0.0;
        double ruj = ru ? ru[j] : 0.0;
        if (iterate_->has_barrier_lb(j))
            rhs1[j] += (sl[j] + zl[j]*rlj) / xl[j];
        if (iterate_->has_barrier_ub(j))
            rhs1[j] -= (su[j] - zu[j]*ruj) / xu[j];
        if (iterate_->StateOf(j) == Iterate::State::fixed)
            rhs1[j] = 0.0;
    }
    assert(AllFinite(rhs1));
    if (rb)
        std::copy(rb, rb+m, std::begin(rhs2));

    // Solve KKT system.
    double tol =  control_.kkt_tol() * std::sqrt(iterate_->mu());
    kkt_->Solve(rhs1, rhs2, tol, dx, dy, info_);
    if (info_->errflag)
        return;

    // Recover solution to Newton system.
    dy *= -1.0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!rl || rl[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else {
            double rlj = rl ? rl[j] : 0.0;
            dxl[j] = dx[j] - rlj;
            dzl[j] = (sl[j] - zl[j]*dxl[j]) / xl[j];
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!ru || ru[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else {
            double ruj = ru ? ru[j] : 0.0;
            dxu[j] = ruj - dx[j];
            dzu[j] = (su[j] - zu[j]*dxu[j]) / xu[j];
        }
    }
    assert(AllFinite(dxl));
    assert(AllFinite(dxu));
    assert(AllFinite(dzl));
    assert(AllFinite(dzu));

    // Shift residual to the last two block equations.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::barrier) {
            assert(std::isfinite(xl[j]) || std::isfinite(xu[j]));
            double atdy = DotColumn(AI, j, dy);
            double rcj = rc ? rc[j] : 0.0;
            if (std::isfinite(xl[j]) && std::isfinite(xu[j])) {
                if (zl[j]*xu[j] >= zu[j]*xl[j])
                    dzl[j] = rcj + dzu[j] - atdy;
                else
                    dzu[j] = -rcj + dzl[j] + atdy;
            } else if (std::isfinite(xl[j])) {
                dzl[j] = rcj + dzu[j] - atdy;
            } else {
                dzu[j] = -rcj + dzl[j] + atdy;
            }
        }
    }

    #ifndef NDEBUG
    // Check solution for free and fixed variables.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            assert(dxl[j] == 0.0 && dxu[j] == 0.0);
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
        }
        if (iterate_->StateOf(j) == Iterate::State::free)
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
    }
    #endif
}